

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O3

void __thiscall
helics::UnknownHandleManager::processUnknownLinks
          (UnknownHandleManager *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType)>
          *cfunc)

{
  undefined8 uVar1;
  undefined8 in_RAX;
  _Hash_node_base *p_Var2;
  undefined8 local_38;
  
  p_Var2 = (this->unknown_links)._M_h._M_before_begin._M_nxt;
  local_38 = in_RAX;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_38 = CONCAT62(local_38._2_6_,0x7000);
      local_38 = CONCAT71(local_38._1_7_,0x69);
      if (*(long *)(cfunc + 0x10) == 0) goto LAB_00365e8e;
      (**(code **)(cfunc + 0x18))(cfunc,p_Var2 + 1,(long)&local_38 + 1,p_Var2 + 5,&local_38);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  p_Var2 = (this->unknown_endpoint_links)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      uVar1 = local_38;
      local_38 = CONCAT44(local_38._4_4_,0x65000000);
      local_38._0_3_ = CONCAT12(0x65,(short)uVar1);
      if (*(long *)(cfunc + 0x10) == 0) goto LAB_00365e8e;
      (**(code **)(cfunc + 0x18))
                (cfunc,p_Var2 + 1,(long)&local_38 + 3,p_Var2 + 5,(long)&local_38 + 2);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  p_Var2 = (this->unknown_dest_filters)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      uVar1 = local_38;
      local_38 = CONCAT26(local_38._6_2_,0x660000000000);
      local_38._0_5_ = CONCAT14(0x65,(int)uVar1);
      if (*(long *)(cfunc + 0x10) == 0) goto LAB_00365e8e;
      (**(code **)(cfunc + 0x18))
                (cfunc,p_Var2 + 1,(long)&local_38 + 5,p_Var2 + 5,(long)&local_38 + 4);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  p_Var2 = (this->unknown_src_filters)._M_h._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    do {
      local_38 = CONCAT17(0x66,CONCAT16(0x65,(undefined6)local_38));
      if (*(long *)(cfunc + 0x10) == 0) {
LAB_00365e8e:
        std::__throw_bad_function_call();
      }
      (**(code **)(cfunc + 0x18))
                (cfunc,p_Var2 + 1,(long)&local_38 + 7,p_Var2 + 5,(long)&local_38 + 6);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void UnknownHandleManager::processUnknownLinks(
    const std::function<
        void(const std::string& origin, InterfaceType, const std::string& target, InterfaceType)>&
        cfunc) const
{
    for (const auto& dlink : unknown_links) {
        cfunc(dlink.first, InterfaceType::PUBLICATION, dlink.second, InterfaceType::INPUT);
    }
    for (const auto& uept : unknown_endpoint_links) {
        cfunc(uept.first, InterfaceType::ENDPOINT, uept.second, InterfaceType::ENDPOINT);
    }
    for (const auto& ufilt : unknown_dest_filters) {
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second, InterfaceType::ENDPOINT);
    }
    for (const auto& ufilt : unknown_src_filters) {
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second, InterfaceType::ENDPOINT);
    }
}